

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O1

int ksplit_core(char *s,int delimiter,int *_max,int **_offsets)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  long lVar5;
  ushort **ppuVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  int local_54;
  int *local_50;
  
  iVar2 = *_max;
  local_50 = *_offsets;
  sVar3 = strlen(s);
  if ((int)sVar3 < 0) {
    local_54 = 0;
  }
  else {
    uVar8 = 0;
    local_54 = 0;
    uVar9 = 0;
    iVar7 = 0;
    do {
      if (delimiter == 0) {
        ppuVar6 = __ctype_b_loc();
        uVar1 = (*ppuVar6)[iVar7];
        if (((long)s[uVar8] == 0) || (((*ppuVar6)[s[uVar8]] & 0x2000) != 0)) {
          if ((short)uVar1 < 0) {
            s[uVar8] = '\0';
            piVar4 = local_50;
            if (local_54 == iVar2) {
              bVar10 = iVar2 == 0;
              iVar2 = iVar2 * 2;
              if (bVar10) {
                iVar2 = 2;
              }
              piVar4 = (int *)realloc(local_50,(long)iVar2 << 2);
              if (piVar4 == (int *)0x0) {
                free(local_50);
                *_offsets = (int *)0x0;
                return 0;
              }
            }
            lVar5 = (long)local_54;
            local_54 = local_54 + 1;
            piVar4[lVar5] = (int)uVar9;
            local_50 = piVar4;
          }
        }
        else {
          if (iVar7 == 0) {
            uVar9 = uVar8 & 0xffffffff;
          }
          if ((uVar1 & 0x2000) != 0) {
            uVar9 = uVar8 & 0xffffffff;
          }
        }
      }
      else if (s[uVar8] == '\0' || s[uVar8] == delimiter) {
        if (iVar7 != delimiter && iVar7 != 0) {
          s[uVar8] = '\0';
          piVar4 = local_50;
          if (local_54 == iVar2) {
            bVar10 = iVar2 == 0;
            iVar2 = iVar2 * 2;
            if (bVar10) {
              iVar2 = 2;
            }
            piVar4 = (int *)realloc(local_50,(long)iVar2 << 2);
            if (piVar4 == (int *)0x0) {
              free(local_50);
              *_offsets = (int *)0x0;
              return 0;
            }
          }
          lVar5 = (long)local_54;
          local_54 = local_54 + 1;
          piVar4[lVar5] = (int)uVar9;
          local_50 = piVar4;
        }
      }
      else {
        if (iVar7 == 0) {
          uVar9 = uVar8 & 0xffffffff;
        }
        if (iVar7 == delimiter) {
          uVar9 = uVar8 & 0xffffffff;
        }
      }
      iVar7 = (int)s[uVar8];
      uVar8 = uVar8 + 1;
    } while ((int)sVar3 + 1 != uVar8);
  }
  *_max = iVar2;
  *_offsets = local_50;
  return local_54;
}

Assistant:

int ksplit_core(char *s, int delimiter, int *_max, int **_offsets)
{
	int i, n, max, last_char, last_start, *offsets, l;
	n = 0; max = *_max; offsets = *_offsets;
	l = strlen(s);
	
#define __ksplit_aux do {						\
		if (_offsets) {						\
			s[i] = 0;					\
			if (n == max) {					\
				int *tmp;				\
				max = max? max<<1 : 2;			\
				if ((tmp = (int*)realloc(offsets, sizeof(int) * max))) {  \
					offsets = tmp;			\
				} else	{				\
					free(offsets);			\
					*_offsets = NULL;		\
					return 0;			\
				}					\
			}						\
			offsets[n++] = last_start;			\
		} else ++n;						\
	} while (0)

	for (i = 0, last_char = last_start = 0; i <= l; ++i) {
		if (delimiter == 0) {
			if (isspace(s[i]) || s[i] == 0) {
				if (isgraph(last_char)) __ksplit_aux; // the end of a field
			} else {
				if (isspace(last_char) || last_char == 0) last_start = i;
			}
		} else {
			if (s[i] == delimiter || s[i] == 0) {
				if (last_char != 0 && last_char != delimiter) __ksplit_aux; // the end of a field
			} else {
				if (last_char == delimiter || last_char == 0) last_start = i;
			}
		}
		last_char = s[i];
	}
	*_max = max; *_offsets = offsets;
	return n;
}